

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjson.h
# Opt level: O0

bool __thiscall pjson::document::deserialize_start(document *this,uint8 *pStr)

{
  uint8 uVar1;
  uint8 *puVar2;
  bool local_21;
  uint8 c;
  bool success;
  uint8 *pStr_local;
  document *this_local;
  
  value_variant::set_to_null(&this->super_value_variant);
  pool_allocator::reset(&this->m_allocator);
  this->m_pStart = pStr;
  puVar2 = skip_whitespace(this,pStr);
  this->m_pStr = puVar2;
  if (*this->m_pStr == '\0') {
    this_local._7_1_ = set_error(this,this->m_pStr,"Nothing to deserialize");
  }
  else {
    uVar1 = *this->m_pStr;
    if ((uVar1 == '{') || (uVar1 == '[')) {
      value_variant::set_to_node(&this->super_value_variant,uVar1 == '{');
      local_21 = deserialize_internal(this);
      if (local_21) {
        puVar2 = skip_whitespace(this,this->m_pStr);
        this->m_pStr = puVar2;
        local_21 = *this->m_pStr == '\0';
        if (!local_21) {
          set_error(this,this->m_pStr,"Unknown data at end of document");
        }
      }
      this_local._7_1_ = local_21;
    }
    else {
      this_local._7_1_ = set_error(this,this->m_pStr,"Root value must be an object or array");
    }
  }
  return this_local._7_1_;
}

Assistant:

bool deserialize_start(uint8* pStr)
      {
         set_to_null();

#if PJSON_PARSE_STATS
         m_parse_stats.clear();
#endif

         m_allocator.reset();

         m_pStart = pStr;
         
         m_pStr = skip_whitespace(pStr);
         
         if (!*m_pStr)
            return set_error(m_pStr, "Nothing to deserialize");

         bool success = false;

         uint8 c = *m_pStr;
         if ((c == '{') || (c == '['))
         {
            set_to_node(c == '{'); PJSON_INCREMENT_STAT(m_num_control);
            success = deserialize_internal();
         }
         else
            return set_error(m_pStr, "Root value must be an object or array");

         if (success)
         {
            m_pStr = skip_whitespace(m_pStr);
            success = !*m_pStr;
            if (!success)
               set_error(m_pStr, "Unknown data at end of document");
         }

         return success;
      }